

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32i386.c
# Opt level: O2

uint8_t i386_reloc_elf2vlink(uint8_t rtype,RelocInsert *ri)

{
  if (rtype < 0xb) {
    ri->bpos = 0;
    ri->bsiz = i386_reloc_elf2vlink::convertV4[rtype].bsiz;
    ri->mask = -1;
    return i386_reloc_elf2vlink::convertV4[rtype].rtype;
  }
  return '\0';
}

Assistant:

static uint8_t i386_reloc_elf2vlink(uint8_t rtype,struct RelocInsert *ri)
/* Determine vlink internal reloc type from ELF reloc type and fill in
   reloc-insert description informations.
   All fields of the RelocInsert structure are preset to zero. */
{
  /* Reloc conversion table for V.4-ABI */
  static struct ELF2vlink convertV4[] = {
    R_NONE,0,0,-1,
    R_ABS,0,32,-1,              /* R_386_32 */
    R_PC,0,32,-1,               /* R_386_PC32 */
    R_GOT,0,32,-1,              /* R_386_GOT32 */
    R_PLT,0,32,-1,              /* R_386_PLT32 */
    R_COPY,0,32,-1,             /* R_386_COPY */
    R_GLOBDAT,0,32,-1,          /* R_386_GLOB_DAT */
    R_JMPSLOT,0,0,-1,           /* R_386_JMP_SLOT */
    R_LOADREL,0,32,-1,          /* R_386_RELATIVE */
    R_GOTOFF,0,32,-1,           /* R_386_GOTOFF */
    R_GOTPC,0,32,-1             /* R_386_GOTPC */
  };

  if (rtype <= R_386_GOTPC) {
    ri->bpos = convertV4[rtype].bpos;
    ri->bsiz = convertV4[rtype].bsiz;
    ri->mask = convertV4[rtype].mask;
    rtype = convertV4[rtype].rtype;
  }
  else
    rtype = R_NONE;

  return rtype;
}